

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilereaderMps.cpp
# Opt level: O3

FilereaderRetcode __thiscall
FilereaderMps::readModelFromFile
          (FilereaderMps *this,HighsOptions *options,string *filename,HighsModel *model)

{
  HighsLogOptions *pHVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *col_names;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *row_names;
  double dVar2;
  pointer pcVar3;
  char cVar4;
  FreeFormatParserReturnCode FVar5;
  FilereaderRetcode FVar6;
  string local_4c0;
  string local_4a0;
  bool warning_issued;
  undefined7 uStack_47f;
  bool local_478;
  _Alloc_hider local_458;
  size_type local_450;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_448;
  ObjSense local_438;
  undefined1 local_430 [280];
  pointer local_318;
  pointer piStack_310;
  pointer local_308;
  pointer piStack_300;
  pointer local_2f8;
  pointer piStack_2f0;
  pointer local_2e8;
  pointer pdStack_2e0;
  pointer local_2d8;
  _Bit_type *p_Stack_2d0;
  uint local_2c8;
  _Bit_type *local_2c0;
  uint local_2b8;
  _Bit_pointer local_2b0;
  _Alloc_hider local_2a0;
  size_type local_298;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_290;
  _Alloc_hider local_278;
  size_type local_270;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_268 [2];
  _Bit_type *local_248;
  uint local_240;
  _Bit_type *local_238;
  uint local_230;
  _Bit_pointer local_228;
  bool local_220;
  _Alloc_hider local_218;
  size_type local_210;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_208;
  undefined1 local_1f8 [312];
  __node_base_ptr *local_c0;
  size_type local_b8;
  __node_base local_b0;
  size_type sStack_a8;
  float local_a0;
  size_t local_98;
  __node_base_ptr p_Stack_90;
  __node_base_ptr *local_88;
  size_type local_80;
  __node_base local_78;
  size_type sStack_70;
  float local_68;
  size_t local_60;
  __node_base_ptr p_Stack_58;
  _Alloc_hider local_50;
  size_type local_48;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  cVar4 = (options->super_HighsOptionsStruct).mps_parser_type_free;
  if ((bool)cVar4 == true) {
    local_458._M_p = (pointer)&local_448;
    _warning_issued = INFINITY;
    local_478 = false;
    local_450 = 0;
    local_448._M_local_buf[0] = '\0';
    local_438 = kMinimize;
    local_2c0 = (_Bit_type *)0x0;
    local_2b8 = 0;
    local_2b0 = (_Bit_pointer)0x0;
    memset(local_430,0,0x110);
    local_318 = (pointer)0x0;
    piStack_310 = (pointer)0x0;
    local_308 = (pointer)0x0;
    piStack_300 = (pointer)0x0;
    local_2f8 = (pointer)0x0;
    piStack_2f0 = (pointer)0x0;
    local_2e8 = (pointer)0x0;
    pdStack_2e0 = (pointer)0x0;
    local_2d8 = (pointer)0x0;
    p_Stack_2d0 = (_Bit_type *)0x0;
    local_2c8 = 0;
    local_298 = 0;
    local_290._M_local_buf[0] = '\0';
    local_278._M_p = (pointer)local_268;
    local_270 = 0;
    local_268[0]._M_local_buf[0] = '\0';
    local_248 = (_Bit_type *)0x0;
    local_240 = 0;
    local_238 = (_Bit_type *)0x0;
    local_230 = 0;
    local_228 = (_Bit_pointer)0x0;
    local_220 = true;
    local_218._M_p = (pointer)&local_208;
    local_210 = 0;
    local_208._M_local_buf[0] = '\0';
    local_2a0._M_p = (pointer)&local_290;
    memset(local_1f8,0,0x138);
    local_b8 = 1;
    local_b0._M_nxt = (_Hash_node_base *)0x0;
    sStack_a8 = 0;
    local_a0 = 1.0;
    local_98 = 0;
    p_Stack_90 = (__node_base_ptr)0x0;
    local_88 = &p_Stack_58;
    local_80 = 1;
    local_78._M_nxt = (_Hash_node_base *)0x0;
    sStack_70 = 0;
    local_68 = 1.0;
    local_60 = 0;
    p_Stack_58 = (__node_base_ptr)0x0;
    local_50._M_p = (pointer)&local_40;
    local_48 = 0;
    local_40._M_local_buf[0] = '\0';
    dVar2 = (options->super_HighsOptionsStruct).time_limit;
    if ((long)dVar2 - 1U < 0xfffffffffffff ||
        -1 < (long)dVar2 && (uint)((long)ABS(dVar2) + 0xfff0000000000000U >> 0x35) < 0x3ff) {
      _warning_issued = dVar2;
    }
    pcVar3 = (filename->_M_dataplus)._M_p;
    local_4a0._M_dataplus._M_p = (pointer)&local_4a0.field_2;
    local_c0 = &p_Stack_90;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4a0,pcVar3,pcVar3 + filename->_M_string_length);
    pHVar1 = &(options->super_HighsOptionsStruct).log_options;
    FVar5 = free_format_parser::HMpsFF::loadProblem
                      ((HMpsFF *)&warning_issued,pHVar1,&local_4a0,model);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4a0._M_dataplus._M_p != &local_4a0.field_2) {
      operator_delete(local_4a0._M_dataplus._M_p);
    }
    switch(FVar5) {
    case kSuccess:
      HighsSparseMatrix::ensureColwise(&(model->lp_).a_matrix_);
      FVar6 = (FilereaderRetcode)local_478;
      break;
    case kParserError:
      FVar6 = kParserError;
      break;
    case kFileNotFound:
      FVar6 = kFileNotFound;
      break;
    case kFixedFormat:
      highsLogUser(pHVar1,kWarning,
                   "Free format reader has detected row/col names with spaces: switching to fixed format parser\n"
                  );
    default:
      free_format_parser::HMpsFF::~HMpsFF((HMpsFF *)&warning_issued);
      cVar4 = (options->super_HighsOptionsStruct).mps_parser_type_free;
      goto LAB_001f20bb;
    case kTimeout:
      FVar6 = kTimeout;
      highsLogUser(pHVar1,kWarning,
                   "Free format reader reached time_limit while parsing the input file\n");
    }
    free_format_parser::HMpsFF::~HMpsFF((HMpsFF *)&warning_issued);
  }
  else {
LAB_001f20bb:
    _warning_issued = (double)CONCAT71(uStack_47f,cVar4);
    pHVar1 = &(options->super_HighsOptionsStruct).log_options;
    local_4c0._M_dataplus._M_p = (pointer)&local_4c0.field_2;
    pcVar3 = (filename->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_4c0,pcVar3,pcVar3 + filename->_M_string_length);
    col_names = &(model->lp_).col_names_;
    row_names = &(model->lp_).row_names_;
    FVar6 = readMps(pHVar1,&local_4c0,-1,-1,&(model->lp_).num_row_,(HighsInt *)model,
                    &(model->lp_).sense_,&(model->lp_).offset_,&(model->lp_).a_matrix_.start_,
                    &(model->lp_).a_matrix_.index_,&(model->lp_).a_matrix_.value_,
                    &(model->lp_).col_cost_,&(model->lp_).col_lower_,&(model->lp_).col_upper_,
                    &(model->lp_).row_lower_,&(model->lp_).row_upper_,&(model->lp_).integrality_,
                    &(model->lp_).objective_name_,col_names,row_names,&(model->hessian_).dim_,
                    &(model->hessian_).start_,&(model->hessian_).index_,&(model->hessian_).value_,
                    &(model->lp_).cost_row_location_,&warning_issued,
                    (options->super_HighsOptionsStruct).keep_n_rows);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_4c0._M_dataplus._M_p != &local_4c0.field_2) {
      operator_delete(local_4c0._M_dataplus._M_p);
    }
    if (FVar6 == kOk) {
      HighsSparseMatrix::ensureColwise(&(model->lp_).a_matrix_);
      hasNamesWithSpaces(pHVar1,(model->lp_).num_col_,col_names);
      hasNamesWithSpaces(pHVar1,(model->lp_).num_row_,row_names);
      FVar6 = (FilereaderRetcode)warning_issued;
    }
    else {
      hasNamesWithSpaces(pHVar1,(model->lp_).num_col_,col_names);
      hasNamesWithSpaces(pHVar1,(model->lp_).num_row_,row_names);
    }
  }
  return FVar6;
}

Assistant:

FilereaderRetcode FilereaderMps::readModelFromFile(const HighsOptions& options,
                                                   const std::string filename,
                                                   HighsModel& model) {
  HighsLp& lp = model.lp_;
  HighsHessian& hessian = model.hessian_;
  // if free format parser
  // Parse file and return status.
  if (options.mps_parser_type_free) {
    HMpsFF parser{};
    if (options.time_limit < kHighsInf && options.time_limit > 0)
      parser.time_limit_ = options.time_limit;

    FreeFormatParserReturnCode result =
        parser.loadProblem(options.log_options, filename, model);
    switch (result) {
      case FreeFormatParserReturnCode::kSuccess:
        lp.ensureColwise();
        assert(model.lp_.objective_name_ != "");
        return parser.warning_issued_ ? FilereaderRetcode::kWarning
                                      : FilereaderRetcode::kOk;
      case FreeFormatParserReturnCode::kParserError:
        return FilereaderRetcode::kParserError;
      case FreeFormatParserReturnCode::kFileNotFound:
        return FilereaderRetcode::kFileNotFound;
      case FreeFormatParserReturnCode::kFixedFormat:
        highsLogUser(options.log_options, HighsLogType::kWarning,
                     "Free format reader has detected row/col names with "
                     "spaces: switching to fixed format parser\n");
        break;
      case FreeFormatParserReturnCode::kTimeout:
        highsLogUser(options.log_options, HighsLogType::kWarning,
                     "Free format reader reached time_limit while parsing "
                     "the input file\n");
        return FilereaderRetcode::kTimeout;
    }
  }

  // else use fixed format parser
  //
  // If the fixed format parser has had to be used, then a warning was
  // issued, otherwise no warning has yet been issued
  bool warning_issued = options.mps_parser_type_free;
  FilereaderRetcode return_code =
      readMps(options.log_options, filename, -1, -1, lp.num_row_, lp.num_col_,
              lp.sense_, lp.offset_, lp.a_matrix_.start_, lp.a_matrix_.index_,
              lp.a_matrix_.value_, lp.col_cost_, lp.col_lower_, lp.col_upper_,
              lp.row_lower_, lp.row_upper_, lp.integrality_, lp.objective_name_,
              lp.col_names_, lp.row_names_, hessian.dim_, hessian.start_,
              hessian.index_, hessian.value_, lp.cost_row_location_,
              warning_issued, options.keep_n_rows);
  if (return_code == FilereaderRetcode::kOk) lp.ensureColwise();
  // Comment on existence of names with spaces
  hasNamesWithSpaces(options.log_options, lp.num_col_, lp.col_names_);
  hasNamesWithSpaces(options.log_options, lp.num_row_, lp.row_names_);
  assert(model.lp_.objective_name_ != "");
  if (return_code == FilereaderRetcode::kOk && warning_issued)
    return_code = FilereaderRetcode::kWarning;
  return return_code;
}